

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void init_motion_compensation_hex(search_site_config *cfg,int stride,int level)

{
  FULLPEL_MV FVar1;
  FULLPEL_MV *mv;
  int in_ESI;
  long in_RDI;
  search_site *site;
  int j;
  int i;
  int radius;
  int local_1c;
  int local_18;
  int local_14;
  
  *(int *)(in_RDI + 0xc64) = in_ESI;
  local_14 = 1;
  for (local_18 = 0; local_18 < 0xb; local_18 = local_18 + 1) {
    *(int *)(in_RDI + 0xbb4 + (long)local_18 * 4) =
         init_motion_compensation_hex::hex_num_candidates[local_18];
    *(int *)(in_RDI + 0xc0c + (long)local_18 * 4) = local_14;
    for (local_1c = 0; local_1c < init_motion_compensation_hex::hex_num_candidates[local_18];
        local_1c = local_1c + 1) {
      mv = (FULLPEL_MV *)(in_RDI + (long)local_18 * 0x88 + (long)local_1c * 8);
      *mv = init_motion_compensation_hex::hex_candidates[local_18][local_1c];
      FVar1 = (FULLPEL_MV)get_offset_from_fullmv(mv,in_ESI);
      mv[1] = FVar1;
    }
    local_14 = local_14 << 1;
  }
  *(undefined4 *)(in_RDI + 0xbb0) = 0xb;
  return;
}

Assistant:

static void init_motion_compensation_hex(search_site_config *cfg, int stride,
                                         int level) {
  (void)level;
  cfg->stride = stride;
  // First scale has 8-closest points, the rest have 6 points in hex shape
  // at increasing scales.
  static const int hex_num_candidates[MAX_PATTERN_SCALES] = { 8, 6, 6, 6, 6, 6,
                                                              6, 6, 6, 6, 6 };
  // Note that the largest candidate step at each scale is 2^scale.
  /* clang-format off */
    static const FULLPEL_MV
        hex_candidates[MAX_PATTERN_SCALES][MAX_PATTERN_CANDIDATES] = {
        { { -1, -1 }, { 0, -1 }, { 1, -1 }, { 1, 0 }, { 1, 1 }, { 0, 1 },
          { -1, 1 }, { -1, 0 } },
        { { -1, -2 }, { 1, -2 }, { 2, 0 }, { 1, 2 }, { -1, 2 }, { -2, 0 } },
        { { -2, -4 }, { 2, -4 }, { 4, 0 }, { 2, 4 }, { -2, 4 }, { -4, 0 } },
        { { -4, -8 }, { 4, -8 }, { 8, 0 }, { 4, 8 }, { -4, 8 }, { -8, 0 } },
        { { -8, -16 }, { 8, -16 }, { 16, 0 }, { 8, 16 },
          { -8, 16 }, { -16, 0 } },
        { { -16, -32 }, { 16, -32 }, { 32, 0 }, { 16, 32 }, { -16, 32 },
          { -32, 0 } },
        { { -32, -64 }, { 32, -64 }, { 64, 0 }, { 32, 64 }, { -32, 64 },
          { -64, 0 } },
        { { -64, -128 }, { 64, -128 }, { 128, 0 }, { 64, 128 },
          { -64, 128 }, { -128, 0 } },
        { { -128, -256 }, { 128, -256 }, { 256, 0 }, { 128, 256 },
          { -128, 256 }, { -256, 0 } },
        { { -256, -512 }, { 256, -512 }, { 512, 0 }, { 256, 512 },
          { -256, 512 }, { -512, 0 } },
        { { -512, -1024 }, { 512, -1024 }, { 1024, 0 }, { 512, 1024 },
          { -512, 1024 }, { -1024, 0 } },
    };

  /* clang-format on */
  int radius = 1;
  for (int i = 0; i < MAX_PATTERN_SCALES; ++i) {
    cfg->searches_per_step[i] = hex_num_candidates[i];
    cfg->radius[i] = radius;
    for (int j = 0; j < hex_num_candidates[i]; ++j) {
      search_site *const site = &cfg->site[i][j];
      site->mv = hex_candidates[i][j];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    radius *= 2;
  }
  cfg->num_search_steps = MAX_PATTERN_SCALES;
}